

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::StringFromGTestEnv_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *flag,char *default_value)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined1 local_68 [8];
  string env_var;
  long local_38;
  
  FlagToEnvVar_abi_cxx11_((string *)local_68,this,flag);
  pcVar4 = getenv((char *)local_68);
  if (pcVar4 == (char *)0x0) {
    iVar3 = strcmp((char *)this,"output");
    if (iVar3 == 0) {
      pcVar4 = getenv("XML_OUTPUT_FILE");
      if (pcVar4 != (char *)0x0) {
        env_var.field_2._8_8_ = &stack0xffffffffffffffc8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&env_var.field_2 + 8),"xml:","");
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&env_var.field_2 + 8),pcVar4);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar1 = (pbVar6->_M_dataplus)._M_p;
        paVar7 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 == paVar7) {
          uVar2 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        if ((long *)env_var.field_2._8_8_ != &stack0xffffffffffffffc8) {
          operator_delete((void *)env_var.field_2._8_8_,local_38 + 1);
        }
        goto LAB_00a40bfc;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,flag,
               (allocator<char> *)(env_var.field_2._M_local_buf + 8));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar5 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + sVar5);
  }
LAB_00a40bfc:
  if (local_68 != (undefined1  [8])&env_var._M_string_length) {
    operator_delete((void *)local_68,env_var._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
  const std::string env_var = FlagToEnvVar(flag);
  const char* value = posix::GetEnv(env_var.c_str());
  if (value != NULL) {
    return value;
  }

  // As a special case for the 'output' flag, if GTEST_OUTPUT is not
  // set, we look for XML_OUTPUT_FILE, which is set by the Bazel build
  // system.  The value of XML_OUTPUT_FILE is a filename without the
  // "xml:" prefix of GTEST_OUTPUT.
  //
  // The net priority order after flag processing is thus:
  //   --gtest_output command line flag
  //   GTEST_OUTPUT environment variable
  //   XML_OUTPUT_FILE environment variable
  //   'default_value'
  if (strcmp(flag, "output") == 0) {
    value = posix::GetEnv("XML_OUTPUT_FILE");
    if (value != NULL) {
      return std::string("xml:") + value;
    }
  }
  return default_value;
}